

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

OrderCancelRequest * __thiscall
Application::queryOrderCancelRequest43(OrderCancelRequest *__return_storage_ptr__,Application *this)

{
  Header *header;
  OrderQty local_240;
  Symbol local_1e8;
  TransactTime local_190;
  Side local_138;
  ClOrdID local_d0;
  OrigClOrdID local_78;
  undefined1 local_19;
  Application *local_18;
  Application *this_local;
  OrderCancelRequest *orderCancelRequest;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Application *)__return_storage_ptr__;
  queryOrigClOrdID(&local_78,this);
  queryClOrdID(&local_d0,this);
  querySide(&local_138,this);
  FIX::TransactTime::TransactTime(&local_190);
  FIX43::OrderCancelRequest::OrderCancelRequest
            (__return_storage_ptr__,&local_78,&local_d0,&local_138,&local_190);
  FIX::TransactTime::~TransactTime(&local_190);
  FIX::Side::~Side(&local_138);
  FIX::ClOrdID::~ClOrdID(&local_d0);
  FIX::OrigClOrdID::~OrigClOrdID(&local_78);
  querySymbol(&local_1e8,this);
  FIX43::OrderCancelRequest::set(__return_storage_ptr__,&local_1e8);
  FIX::Symbol::~Symbol(&local_1e8);
  queryOrderQty(&local_240,this);
  FIX43::OrderCancelRequest::set(__return_storage_ptr__,&local_240);
  FIX::OrderQty::~OrderQty(&local_240);
  header = FIX43::Message::getHeader(&__return_storage_ptr__->super_Message);
  queryHeader(this,(Header *)header);
  return __return_storage_ptr__;
}

Assistant:

FIX43::OrderCancelRequest Application::queryOrderCancelRequest43() {
  FIX43::OrderCancelRequest orderCancelRequest(queryOrigClOrdID(), queryClOrdID(), querySide(), FIX::TransactTime());

  orderCancelRequest.set(querySymbol());
  orderCancelRequest.set(queryOrderQty());
  queryHeader(orderCancelRequest.getHeader());
  return orderCancelRequest;
}